

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O2

void __thiscall CTPNListBase::CTPNListBase(CTPNListBase *this)

{
  undefined1 *puVar1;
  
  (this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR___cxa_pure_virtual_0034b610;
  (this->const_val_).typ_ = TC_CVT_UNK;
  puVar1 = &(this->const_val_).field_0x20;
  *puVar1 = *puVar1 & 0xfe;
  this->cnt_ = 0;
  this->head_ = (CTPNListEle *)0x0;
  this->tail_ = (CTPNListEle *)0x0;
  this->field_0x48 = (this->field_0x48 & 0xfc) + 1;
  CTcConstVal::set_list(&this->const_val_,(CTPNList *)this);
  return;
}

Assistant:

CTPNListBase()
    {
        /* there are initially no elements */
        cnt_ = 0;
        head_ = tail_ = 0;

        /* 
         *   initially, the list is constant, because it's just an empty
         *   list; as we add elements, we'll check for constants, and
         *   we'll clear the constant flag the first time we add a
         *   non-constant element 
         */
        is_const_ = TRUE;

        /* presume it's not a lookup table list */
        is_lookup_table_ = FALSE;

        /* set my constant value to point to myself */
        const_val_.set_list((class CTPNList *)this);
    }